

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_rom.h
# Opt level: O0

nes_cartridge * nes_rom_create_ines_cartridge(void *rom_file,size_t rom_file_size)

{
  uint mapper_id_00;
  nes_cartridge *pnVar1;
  void *__src;
  int iVar2;
  uint8_t *prg_ptr;
  nes_cartridge *cartridge;
  nes_mapper mapper;
  size_t cartridge_size;
  int mapper_id;
  ines_header *hdr;
  size_t rom_file_size_local;
  void *rom_file_local;
  
  mapper_id_00 = (uint)(*(byte *)((long)rom_file + 7) >> 4) << 4 |
                 (uint)(*(byte *)((long)rom_file + 6) >> 4);
  mapper.get_nametable_address =
       (_func_uint16_t_nes_cartridge_ptr_uint16_t *)
       ((long)(int)((uint)*(byte *)((long)rom_file + 5) << 0xd) +
       (long)(int)((uint)*(byte *)((long)rom_file + 4) << 0xe) + 0x70);
  nes_mapper_get((nes_mapper *)&cartridge,mapper_id_00);
  mapper.get_nametable_address = mapper.get_nametable_address + (long)&cartridge->prg_rom;
  printf("PRG ROM: %d KB \tCHR ROM: %d KB\n",
         (ulong)(long)(int)((uint)*(byte *)((long)rom_file + 4) << 0xe) / 0x400,
         (ulong)(long)(int)((uint)*(byte *)((long)rom_file + 5) << 0xd) / 0x400);
  printf("mapper: %d\n",(ulong)mapper_id_00);
  pnVar1 = (nes_cartridge *)malloc((size_t)mapper.get_nametable_address);
  pnVar1->mapper = (nes_mapper *)(pnVar1 + 1);
  pnVar1->mapper_state = pnVar1->mapper + 1;
  pnVar1->prg_rom_size = (long)(int)((uint)*(byte *)((long)rom_file + 4) << 0xe);
  pnVar1->chr_rom_size = (long)(int)((uint)*(byte *)((long)rom_file + 5) << 0xd);
  pnVar1->prg_rom = (uint8_t *)((long)pnVar1->mapper_state + (long)cartridge);
  pnVar1->chr_rom = pnVar1->prg_rom + pnVar1->prg_rom_size;
  if ((*(byte *)((long)rom_file + 6) & 1) == 0) {
    pnVar1->mirroring = NES_NAMETABLE_MIRRORING_HORIZONTAL;
  }
  else {
    pnVar1->mirroring = NES_NAMETABLE_MIRRORING_VERTICAL;
  }
  memcpy(pnVar1->mapper,&cartridge,0x38);
  (*(code *)mapper.state_size)(pnVar1);
  iVar2 = 0;
  if ((*(byte *)((long)rom_file + 6) >> 2 & 1) != 0) {
    iVar2 = 0x200;
  }
  __src = (void *)((long)rom_file + (long)iVar2 + 0x10);
  memcpy(pnVar1->prg_rom,__src,pnVar1->prg_rom_size);
  memcpy(pnVar1->chr_rom,(void *)((long)__src + pnVar1->prg_rom_size),pnVar1->chr_rom_size);
  return pnVar1;
}

Assistant:

static nes_cartridge* nes_rom_create_ines_cartridge(const void* rom_file, size_t rom_file_size)
{
    struct ines_header* hdr = (struct ines_header*)rom_file;
    int mapper_id = ((hdr->flags7.mapper_high << 4) | hdr->flags6.mapper_low);

    size_t cartridge_size = sizeof(nes_cartridge) + sizeof(nes_mapper);
    cartridge_size += hdr->prg_rom_size * 16384;
    cartridge_size += hdr->chr_rom_size * 8192;

    nes_mapper mapper = nes_mapper_get(mapper_id);
    cartridge_size += mapper.state_size;

    printf("PRG ROM: %d KB \tCHR ROM: %d KB\n", ((hdr->prg_rom_size * 16384)/1024), ((hdr->chr_rom_size * 8192)/1024));
    printf("mapper: %d\n", mapper_id);

    nes_cartridge* cartridge = (nes_cartridge*)malloc(cartridge_size);
    cartridge->mapper = (nes_mapper*)((uint8_t*)cartridge + sizeof(nes_cartridge));
    cartridge->mapper_state = (uint8_t*)cartridge->mapper + sizeof(nes_mapper);
    cartridge->prg_rom_size = hdr->prg_rom_size * 16384;
    cartridge->chr_rom_size = hdr->chr_rom_size * 8192;
    cartridge->prg_rom = (uint8_t*)cartridge->mapper_state + mapper.state_size;
    cartridge->chr_rom = cartridge->prg_rom + cartridge->prg_rom_size;

    if (hdr->flags6.mirroring)
        cartridge->mirroring = NES_NAMETABLE_MIRRORING_VERTICAL;
    else
        cartridge->mirroring = NES_NAMETABLE_MIRRORING_HORIZONTAL;

    memcpy(cartridge->mapper, &mapper, sizeof(nes_mapper));
    mapper.init(cartridge);

    uint8_t* prg_ptr = (uint8_t*)rom_file + sizeof(struct ines_header) + (hdr->flags6.has_trainer?512:0);
    memcpy(cartridge->prg_rom, prg_ptr, cartridge->prg_rom_size);
    memcpy(cartridge->chr_rom, prg_ptr + cartridge->prg_rom_size, cartridge->chr_rom_size);

    return cartridge;
}